

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::sslErrors(QNetworkReplyImplPrivate *this,QList<QSslError> *errors)

{
  QList<QSslError> *_t1;
  QNetworkReply *in_RSI;
  QNetworkReplyImplPrivate *in_RDI;
  QNetworkReplyImpl *q;
  
  _t1 = (QList<QSslError> *)q_func(in_RDI);
  QNetworkReply::sslErrors(in_RSI,_t1);
  return;
}

Assistant:

void QNetworkReplyImplPrivate::sslErrors(const QList<QSslError> &errors)
{
#ifndef QT_NO_SSL
    Q_Q(QNetworkReplyImpl);
    emit q->sslErrors(errors);
#else
    Q_UNUSED(errors);
#endif
}